

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

void init_ld_script(GlobalVars *gv)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  ObjectUnit *n;
  LinkedSection *ls;
  char *pcVar9;
  size_t sVar10;
  char *name;
  Phdr **__ptr;
  Phdr *pPVar11;
  lword len;
  lword lVar12;
  char *pcVar13;
  MemoryDescr *vmreg;
  char *pcVar14;
  MemoryDescr *lmreg;
  uint32_t type;
  Phdr **local_180;
  Section *local_168;
  char *local_150;
  lword s_lma;
  lword s_addr;
  char namebuf [256];
  
  if (gv->dest_object == 0) {
    scriptbase = gv->ldscript;
    if (scriptbase == (char *)0x0) {
      scriptbase = fff[gv->dest_format]->exeldscript;
    }
  }
  else if ((gv->dest_sharedobj != 0) && (scriptbase = gv->ldscript, scriptbase == (char *)0x0)) {
    scriptbase = fff[gv->dest_format]->soldscript;
  }
  if (scriptbase == (char *)0x0) {
    return;
  }
  current_ls = (LinkedSection *)0x0;
  preparse = 1;
  level = 0;
  defmem = add_memblock("default",0,0x7fffffffffffffff);
  vdefmem = defmem;
  ldefmem = defmem;
  atdefmem = add_memblock("lmadefault",0,0x7fffffffffffffff);
  change_address(defmem,gv->start_addr);
  scriptname = "built-in script";
  if (gv->scriptname != (char *)0x0) {
    scriptname = gv->scriptname;
  }
  snprintf(namebuf,0x100,"Linker Script <%s>");
  pcVar8 = allocstring(namebuf);
  n = art_objunit(gv,pcVar8,(uint8_t *)0x0,0);
  if (n != (ObjectUnit *)0x0) {
    n->flags = n->flags | 0x8001;
    addhead(&gv->selobjects,&n->n);
  }
  script_obj = n;
  init_parser(gv,scriptname,scriptbase,1);
LAB_00112dc9:
  do {
    bVar1 = false;
LAB_00112dcc:
    while( true ) {
      while (pcVar8 = getword(), pcVar8 == (char *)0x0) {
        cVar2 = getchr();
        if (cVar2 != ';') {
          if (cVar2 != '\0') {
            back(1);
            pcVar8 = scriptname;
            uVar6 = getlineno();
            error(0x4e,pcVar8,(ulong)uVar6);
          }
          preparse = 0;
          return;
        }
      }
      iVar4 = strcmp(pcVar8,"MEMORY");
      if (iVar4 != 0) break;
      gv->use_ldscript = 1;
      if (!bVar1) {
        bVar5 = startofblock('{');
        if (bVar5 == 0) goto LAB_00112dc9;
        goto LAB_001133f8;
      }
LAB_00112e71:
      pcVar8 = scriptname;
      uVar6 = getlineno();
      error(100,pcVar8,(ulong)uVar6);
      skipblock(0,'{','}');
      bVar1 = true;
    }
    iVar4 = strcmp(pcVar8,"PHDRS");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar8,"SECTIONS");
      if (iVar4 == 0) {
        gv->use_ldscript = 1;
        pcVar8 = scriptname;
        if (bVar1) {
          uVar6 = getlineno();
          error(0x4a,pcVar8,(ulong)uVar6);
        }
        bVar1 = true;
        if (gv->phdrlist == (Phdr *)0x0) {
          add_phdr(gv," text",1,0x45,-1,defmem,defmem);
          add_phdr(gv," data",1,0x46,-1,defmem,defmem);
        }
        level = 1;
        bVar5 = startofblock('{');
        if (bVar5 != 0) {
          skip();
          secblkbase = gettxtptr();
          secblkline = getlineno();
          local_180 = (Phdr **)0x0;
          do {
            while (pcVar8 = getword(), pcVar8 != (char *)0x0) {
              iVar4 = check_command(gv,pcVar8,0x8002);
              if (iVar4 == 0) {
                cVar2 = getchr();
                if (cVar2 == '=') {
                  symbol_assignment(gv,pcVar8,'\0');
                }
                else {
                  back(1);
                  pcVar8 = allocstring(pcVar8);
                  uVar6 = startofsecdef(&s_addr,namebuf,&s_lma);
                  if (uVar6 == 0) {
                    free(pcVar8);
                    pcVar8 = scriptname;
                    uVar6 = getlineno();
                    error(0x41,pcVar8,(ulong)uVar6);
                  }
                  else {
                    ls = create_lnksect(gv,pcVar8,'\0','\0','\0','\0',0);
                    iVar4 = bcmp(namebuf,"NOLOAD",7);
                    if (iVar4 == 0) {
                      *(byte *)&ls->ld_flags = (byte)ls->ld_flags | 1;
                    }
                    if (3 < uVar6) {
                      ls->destmem = atdefmem;
                    }
                    new_ls_name = ls->name;
                    level = 2;
                    local_168 = (Section *)0x0;
                    do {
                      while (pcVar9 = getpattern(), pcVar9 != (char *)0x0) {
                        iVar4 = check_command(gv,pcVar9,0x8002);
                        if (iVar4 == 0) {
                          cVar2 = getchr();
                          pcVar13 = scriptname;
                          if (cVar2 == '=') {
                            symbol_assignment(gv,pcVar9,'\0');
                          }
                          else if (cVar2 == '(') {
                            if (local_168 == (Section *)0x0) {
                              pcVar9 = getpattern();
                              if (pcVar9 == (char *)0x0) {
                                ierror("make_dummy_sec_from_pattern(): no pattern?");
                              }
                              sVar10 = strlen(pcVar9);
                              name = (char *)alloc(sVar10 + 1);
                              pcVar13 = name;
                              while( true ) {
                                do {
                                  pcVar14 = pcVar9;
                                  cVar2 = *pcVar14;
                                  pcVar9 = pcVar14 + 1;
                                } while (cVar2 == '*');
                                if (cVar2 == '\0') break;
                                if (cVar2 == '[') {
                                  cVar2 = *pcVar9;
                                  if (cVar2 != '\0') {
                                    pcVar9 = pcVar14 + 2;
                                    *pcVar13 = cVar2;
                                    pcVar13 = pcVar13 + 1;
                                  }
                                  for (; (cVar2 = *pcVar9, cVar2 != '\0' && (cVar2 != ']'));
                                      pcVar9 = pcVar9 + 1) {
                                  }
                                  pcVar9 = pcVar9 + (cVar2 == ']');
                                }
                                else if (cVar2 == '?') {
                                  *pcVar13 = '_';
                                  pcVar13 = pcVar13 + 1;
                                }
                                else {
                                  *pcVar13 = cVar2;
                                  pcVar13 = pcVar13 + 1;
                                }
                              }
                              *pcVar13 = '\0';
                              local_168 = create_section(script_obj,name,(uint8_t *)0x0,0);
                              local_168->lnksec = ls;
                              addtail(&ls->sections,&local_168->n);
                            }
                            skipblock(1,'(',')');
                          }
                          else {
                            uVar6 = getlineno();
                            error(0x41,pcVar13,(ulong)uVar6);
                            back(1);
                          }
                        }
                      }
                      cVar2 = getchr();
                    } while (cVar2 == ';');
                    back(1);
                    level = 1;
                    new_ls_name = (char *)0x0;
                    __ptr = endofsecdef(gv,ls);
                    if (__ptr == (Phdr **)0x0) {
                      if (ls->relocmem == (MemoryDescr *)0x0) {
                        ls->relocmem = vdefmem;
                      }
                      if (ls->destmem == (MemoryDescr *)0x0) {
                        ls->destmem = ldefmem;
                      }
                    }
                    else {
                      if (ls->relocmem == (MemoryDescr *)0x0) {
                        ls->relocmem = vdefmem;
                      }
                      if (ls->destmem == (MemoryDescr *)0x0) {
                        ls->destmem = ldefmem;
                      }
                      pPVar11 = *__ptr;
                      if (local_180 == (Phdr **)0x0 || pPVar11 != (Phdr *)0x0) {
                        if (__ptr != local_180 && pPVar11 != (Phdr *)0x0) {
                          free(local_180);
                          goto LAB_001132c0;
                        }
                      }
                      else {
                        free(__ptr);
                        __ptr = local_180;
LAB_001132c0:
                        pPVar11 = *__ptr;
                        local_180 = __ptr;
                      }
                      if (pPVar11 == (Phdr *)0x0) {
                        lmreg = ls->destmem;
                        vmreg = ls->relocmem;
                        if (lmreg == vmreg && vmreg == defmem) {
                          use_segment(gv," text",1,defmem,defmem);
                          pcVar9 = " data";
                          vmreg = defmem;
                          lmreg = defmem;
                        }
                        else {
                          pcVar9 = " load";
                        }
                        use_segment(gv,pcVar9,1,vmreg,lmreg);
                        uVar3 = guess_special_segment(pcVar8,&local_150);
                        if (uVar3 != 0) {
                          use_segment(gv,local_150,(uint)uVar3,ls->relocmem,ls->destmem);
                        }
                      }
                      else {
                        while (__ptr = __ptr + 1, pPVar11 != (Phdr *)0x0) {
                          if (pPVar11->type != 0) {
                            *(byte *)&pPVar11->flags = (byte)pPVar11->flags | 0x10;
                          }
                          pPVar11 = *__ptr;
                        }
                      }
                    }
                  }
                }
              }
            }
            cVar2 = getchr();
          } while (cVar2 == ';');
          back(1);
          free(local_180);
          endofblock('{','}');
        }
        level = 0;
      }
      else {
        iVar4 = check_command(gv,pcVar8,2);
        if (iVar4 == 0) {
          cVar2 = getchr();
          pcVar9 = scriptname;
          if (cVar2 == '=') {
            symbol_assignment(gv,pcVar8,'\0');
          }
          else {
            uVar6 = getlineno();
            error(0x41,pcVar9,(ulong)uVar6);
            back(1);
          }
        }
      }
      goto LAB_00112dcc;
    }
    gv->use_ldscript = 1;
    if (bVar1) goto LAB_00112e71;
    bVar5 = startofblock('{');
  } while (bVar5 == 0);
LAB_001134b6:
  type = 1;
  do {
    pcVar8 = getword();
    if (pcVar8 == (char *)0x0) {
      endofblock('{','}');
      pPVar11 = (Phdr *)&gv->phdrlist;
      bVar1 = false;
      break;
    }
    strcpy(namebuf,pcVar8);
    pcVar9 = getword();
    pcVar8 = scriptname;
    if (pcVar9 == (char *)0x0) {
      uVar6 = getlineno();
      error(0x4e,pcVar8,(ulong)uVar6);
    }
    else {
      if (((*pcVar9 == 'P') && (pcVar9[1] == 'T')) && (pcVar9[2] == '_')) goto LAB_00113540;
      uVar6 = getlineno();
      error(99,pcVar8,(ulong)uVar6,pcVar9);
    }
    skipblock(1,'\0',';');
  } while( true );
LAB_001136de:
  pPVar11 = pPVar11->next;
  if (pPVar11 != (Phdr *)0x0) {
    if (pPVar11->type == 6) goto LAB_00112dc9;
    if ((pPVar11->flags & 0x400) != 0) {
      bVar1 = true;
    }
    goto LAB_001136de;
  }
  if (bVar1) {
    add_phdr(gv," headers",6,0x400,-1,defmem,defmem);
  }
  goto LAB_00112dc9;
LAB_00113540:
  switch(pcVar9[3]) {
  case 'I':
    type = 3;
    break;
  case 'L':
    break;
  case 'N':
    type = 4;
    break;
  case 'P':
    type = 6;
    break;
  case 'S':
    type = 5;
    break;
  default:
    if (pcVar9[3] == 'D') {
      type = 2;
      break;
    }
  case 'J':
  case 'K':
  case 'M':
  case 'O':
  case 'Q':
  case 'R':
    uVar6 = getlineno();
    type = 0;
    error(99,pcVar8,(ulong)uVar6,pcVar9);
  }
  uVar6 = 0;
  local_180 = (Phdr **)0xffffffffffffffff;
  while (pcVar8 = getword(), pcVar8 != (char *)0x0) {
    iVar4 = strcmp(pcVar8,"FILEHDR");
    if (iVar4 == 0) {
      uVar6 = uVar6 | 0x800;
    }
    else {
      iVar4 = strcmp(pcVar8,"PHDRS");
      if (iVar4 == 0) {
        uVar6 = uVar6 | 0x400;
      }
      else if (((*pcVar8 == 'A') && (pcVar8[1] == 'T')) && (pcVar8[2] == '\0')) {
        local_180 = (Phdr **)term_absexp();
        uVar6 = uVar6 | 0x80;
      }
      else {
        iVar4 = strcmp(pcVar8,"FLAGS");
        pcVar9 = scriptname;
        if (iVar4 == 0) {
          lVar12 = term_absexp();
          uVar6 = uVar6 | (uint)lVar12 & 7 | 0x40;
        }
        else {
          uVar7 = getlineno();
          error(0x41,pcVar9,(ulong)uVar7,pcVar8);
        }
      }
    }
  }
  cVar2 = getchr();
  pcVar8 = scriptname;
  if (cVar2 != ';') {
    uVar7 = getlineno();
    error(0x42,pcVar8,(ulong)uVar7);
    if (cVar2 == '}') goto LAB_00112dc9;
  }
  add_phdr(gv,namebuf,type,(uint16_t)uVar6,(lword)local_180,(MemoryDescr *)0x0,(MemoryDescr *)0x0);
  goto LAB_001134b6;
LAB_001133f8:
  pcVar8 = getword();
  if (pcVar8 == (char *)0x0) goto LAB_001136bc;
  strcpy(namebuf,pcVar8);
  cVar2 = getchr();
  if (cVar2 == '(') {
    skipblock(1,'(',')');
    cVar2 = getchr();
  }
  pcVar8 = scriptname;
  if (cVar2 == ':') {
    lVar12 = readmemparam(gv,"ORIGIN");
    cVar2 = getchr();
    pcVar8 = scriptname;
    if (cVar2 == ',') {
      len = readmemparam(gv,"LENGTH");
      add_memblock(namebuf,lVar12,len);
      goto LAB_001133f8;
    }
    uVar6 = getlineno();
  }
  else {
    uVar6 = getlineno();
  }
  error(0x42,pcVar8,(ulong)uVar6);
  goto LAB_001133f8;
LAB_001136bc:
  endofblock('{','}');
  goto LAB_00112dc9;
}

Assistant:

void init_ld_script(struct GlobalVars *gv)
{
  char c;

  if (!gv->dest_object) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->exeldscript;
  }
  else if (gv->dest_sharedobj) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->soldscript;
  }

  if (scriptbase) {
    bool secdef = FALSE;
    char *keyword;

    /* initialization */
    preparse = TRUE;
    current_ls = NULL;
    level = 0; /* outside SECTIONS block */
    defmem = vdefmem = ldefmem = add_memblock(defmemname,MEM_DEFORG,MEM_DEFLEN);
    atdefmem = add_memblock("lmadefault",MEM_DEFORG,MEM_DEFLEN);
    change_address(defmem,gv->start_addr);
    if (!(scriptname = gv->scriptname))
      scriptname = "built-in script";
    script_obj = make_ld_objunit(gv);

    /* pre-parse script: get memory-regions and symbol definitions */
    init_parser(gv,scriptname,scriptbase,1);

    do {
      while (keyword = getword()) {

        if (!strcmp(keyword,"MEMORY")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_memory(gv);
          }
          else {
            /* MEMORY behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"PHDRS")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_phdrs(gv);
          }
          else {
            /* PHDRS behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"SECTIONS")) {
          gv->use_ldscript = TRUE;
          if (secdef)
            error(74,scriptname,getlineno());  /* SECTIONS block def. twice */
          else
            secdef = TRUE;

          /* Define default PHDRs */
          if (gv->phdrlist == NULL) {
            add_phdr(gv,deftxt,PT_LOAD,PHDR_FLAGS|PF_X|PF_R,
                     ADDR_NONE,defmem,defmem);
            add_phdr(gv,defdat,PT_LOAD,PHDR_FLAGS|PF_R|PF_W,
                     ADDR_NONE,defmem,defmem);
          }
          level = 1;
          predefine_sections(gv);
          level = 0;
        }

        else {
          if (check_command(gv,keyword,SCMDF_GLOBAL)) {
            /* script-command executed */
            continue;
          }

          else if (getchr() == '=') {
            /* symbol assignment */
            symbol_assignment(gv,keyword,0);
          }

          else {
            /* unknown keyword ignored */
            error(65,scriptname,getlineno(),keyword);
            back(1);
          }
        }
      }
    }
    while ((c = getchr()) == ';');

    if (c) {
      back(1);
      error(78,scriptname,getlineno());   /* missing argument */
    }
    preparse = FALSE;
  }
}